

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void __thiscall MD5::final(MD5 *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  MD5 *this_00;
  byte bits [8];
  ulong oldState [4];
  
  uVar2 = this->_state[0];
  uVar3 = this->_state[1];
  uVar1 = this->_count[0];
  encode(this,this->_count,bits,8);
  uVar4 = (uint)(uVar1 >> 3) & 0x3f;
  update(this,PADDING,((ulong)(0x37 < uVar4) << 6 | 0x38) - (ulong)uVar4);
  this_00 = this;
  update(this,bits,8);
  encode(this_00,this->_state,this->_digest,0x10);
  this->_state[0] = uVar2;
  this->_state[1] = uVar3;
  this->_count[0] = uVar1;
  return;
}

Assistant:

void MD5::final()
{

    byte bits[8];
    ulong oldState[4];
    ulong oldCount[2];
    ulong index, padLen;

    /* Save current state and count. */
    memcpy(oldState, _state, 16);
    memcpy(oldCount, _count, 8);

    /* Save number of bits */
    encode(_count, bits, 8);

    /* Pad out to 56 mod 64. */
    index = (ulong) ((_count[0] >> 3) & 0x3f);
    padLen = (index < 56) ? (56 - index) : (120 - index);
    update(PADDING, padLen);

    /* Append length (before padding) */
    update(bits, 8);

    /* Store state in digest */
    encode(_state, _digest, 16);

    /* Restore current state and count. */
    memcpy(_state, oldState, 16);
    memcpy(_count, oldCount, 8);
}